

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O2

void Logger::printLine<long,long>(char *text,long *args,long *args_1)

{
  char *extraout_RDX;
  long *in_R8;
  string_view text_00;
  string message;
  string local_28;
  
  tinyformat::format<long,long>(&local_28,(tinyformat *)text,(char *)args,args_1,in_R8);
  text_00._M_str = extraout_RDX;
  text_00._M_len = (size_t)local_28._M_dataplus._M_p;
  printLine((Logger *)local_28._M_string_length,text_00);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

static void printLine(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		printLine(message);
	}